

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

bool __thiscall
embree::SceneGraph::MultiTransformNode::calculateClosed
          (MultiTransformNode *this,bool group_instancing)

{
  ulong uVar1;
  byte bVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  byte in_SIL;
  long in_RDI;
  undefined1 local_29;
  
  if ((*(byte *)(in_RDI + 0x58) & 1) == 0) {
    uVar1 = CONCAT71((int7)((ulong)in_RCX >> 8),in_SIL) & 0xffffffffffffff01;
    *(char *)(in_RDI + 0x58) = (char)uVar1;
    bVar2 = (**(code **)(**(long **)(in_RDI + 0x80) + 0x38))
                      (*(long **)(in_RDI + 0x80),in_SIL & 1,in_RDX,
                       CONCAT71((int7)(uVar1 >> 8),in_SIL) & 0xffffffffffffff01);
    *(bool *)(in_RDI + 0x58) = (*(byte *)(in_RDI + 0x58) & 1 & bVar2 & 1) != 0;
    *(byte *)(in_RDI + 0x59) = *(byte *)(*(long *)(in_RDI + 0x80) + 0x59) & 1;
  }
  local_29 = false;
  if ((*(byte *)(in_RDI + 0x58) & 1) != 0) {
    local_29 = *(long *)(in_RDI + 0x50) == 1;
  }
  return local_29;
}

Assistant:

bool SceneGraph::MultiTransformNode::calculateClosed(bool group_instancing)
  {
    assert(indegree);
    if (!closed) {
      closed = group_instancing;
      closed &= child->calculateClosed(group_instancing);
      hasLightOrCamera = child->hasLightOrCamera;
    }
    return closed && (indegree == 1);

  }